

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O2

void __thiscall TradeApi::on_order_trade(TradeApi *this,shared_ptr<tquant::api::Trade> *trade)

{
  TradeApiCallback *pTVar1;
  Trade c_trade;
  Trade local_5c;
  
  pTVar1 = this->cb;
  if (pTVar1 != (TradeApiCallback *)0x0) {
    init_ctrade(&local_5c,
                (trade->super___shared_ptr<tquant::api::Trade,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    (*pTVar1->on_trade)(&local_5c,pTVar1->user_data);
  }
  return;
}

Assistant:

virtual void on_order_trade   (shared_ptr<tquant::api::Trade> trade) override {
        if (cb) {
            Trade c_trade;
            init_ctrade(&c_trade, trade.get());
            cb->on_trade(&c_trade, cb->user_data);
        }
    }